

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  uchar uVar6;
  undefined1 auVar7 [16];
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  ulong uVar15;
  byte *pbVar16;
  undefined1 auVar17 [16];
  
  puVar8 = data;
  if (req_comp != img_n) {
    puVar8 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar8 == (uchar *)0x0) {
      free(data);
      puVar8 = (uchar *)0x0;
      stbi__g_failure_reason = "outofmem";
    }
    else {
      if (0 < (int)y) {
        iVar1 = x - 1;
        auVar17[8] = 0xff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        uVar15 = 0;
        uVar11 = 0;
        uVar10 = 0;
        iVar12 = req_comp + img_n * 8;
        do {
          if (iVar12 - 10U < 0x1a) {
            iVar13 = (int)uVar11 * x;
            pbVar16 = data + (uint)(iVar13 * img_n);
            switch(iVar12) {
            case 10:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 * 2 + uVar15] = data[lVar9 + uVar10];
                  puVar8[lVar9 * 2 + uVar15 + 1] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar14 = puVar8 + uVar15 + 2;
                lVar9 = 0;
                do {
                  uVar6 = data[lVar9 + uVar10];
                  lVar9 = lVar9 + 1;
                  *puVar14 = uVar6;
                  puVar14[-1] = uVar6;
                  puVar14[-2] = uVar6;
                  puVar14 = puVar14 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar7 = vpinsrb_avx(auVar17,(uint)data[lVar9 + uVar10],0);
                  auVar7 = vpshufb_avx(auVar7,SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar8 + lVar9 * 4 + uVar15) = auVar7._0_4_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 + uVar15] = data[lVar9 * 2 + uVar10];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar14 = puVar8 + uVar15 + 2;
                lVar9 = 0;
                do {
                  uVar6 = data[lVar9 * 2 + uVar10];
                  lVar9 = lVar9 + 1;
                  *puVar14 = uVar6;
                  puVar14[-1] = uVar6;
                  puVar14[-2] = uVar6;
                  puVar14 = puVar14 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar7 = vpshufb_avx(ZEXT216(*(ushort *)(data + lVar9 * 2 + uVar10)),
                                       SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar8 + lVar9 * 4 + uVar15) = auVar7._0_4_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x19:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = *pbVar16;
                  pbVar2 = pbVar16 + 1;
                  bVar5 = pbVar16[2];
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 + uVar15] =
                       (uchar)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                               (uint)*pbVar2 * 0x96 + (uint)bVar4 * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1a:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = *pbVar16;
                  pbVar2 = pbVar16 + 1;
                  bVar5 = pbVar16[2];
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 * 2 + uVar15] =
                       (uchar)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                               (uint)*pbVar2 * 0x96 + (uint)bVar4 * 0x4d >> 8);
                  puVar8[lVar9 * 2 + uVar15 + 1] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1c:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 * 4 + uVar15] = *pbVar16;
                  puVar8[lVar9 * 4 + uVar15 + 1] = pbVar16[1];
                  pbVar2 = pbVar16 + 2;
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 * 4 + uVar15 + 2] = *pbVar2;
                  puVar8[lVar9 * 4 + uVar15 + 3] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = data[lVar9 * 4 + uVar10 + 2];
                  puVar8[lVar9 + uVar15] =
                       (uchar)((uint)bVar4 * 2 + ((uint)bVar4 + (uint)bVar4 * 8) * 3 +
                               (uint)data[lVar9 * 4 + uVar10 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + uVar10] * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = data[lVar9 * 4 + uVar10 + 2];
                  puVar8[lVar9 * 2 + uVar15] =
                       (uchar)((uint)bVar4 * 2 + ((uint)bVar4 + (uint)bVar4 * 8) * 3 +
                               (uint)data[lVar9 * 4 + uVar10 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + uVar10] * 0x4d >> 8);
                  puVar8[lVar9 * 2 + uVar15 + 1] = data[lVar9 * 4 + uVar10 + 3];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x23:
              if (-1 < iVar1) {
                lVar9 = 0;
                puVar14 = puVar8 + (uint)(iVar13 * req_comp);
                do {
                  *puVar14 = data[lVar9 * 4 + uVar10];
                  puVar14[1] = data[lVar9 * 4 + uVar10 + 1];
                  lVar3 = lVar9 * 4;
                  lVar9 = lVar9 + 1;
                  puVar14[2] = data[lVar3 + uVar10 + 2];
                  puVar14 = puVar14 + 3;
                } while (x != (uint)lVar9);
              }
            }
          }
          uVar10 = (ulong)((int)uVar10 + x * img_n);
          uVar15 = (ulong)((int)uVar15 + x * req_comp);
          uVar11 = uVar11 + 1;
        } while (uVar11 != y);
      }
      free(data);
    }
  }
  return puVar8;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0], dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}